

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cc
# Opt level: O2

int GetSystemCPUsCount(void)

{
  long lVar1;
  
  lVar1 = sysconf(0x54);
  if (lVar1 < 0) {
    lVar1 = 1;
  }
  return (int)lVar1;
}

Assistant:

int GetSystemCPUsCount()
{
#if defined(PLATFORM_WINDOWS)
  // Get the number of processors.
  SYSTEM_INFO info;
  GetSystemInfo(&info);
  return  info.dwNumberOfProcessors;
#else
  long rv = sysconf(_SC_NPROCESSORS_ONLN);
  if (rv < 0) {
    return 1;
  }
  return static_cast<int>(rv);
#endif
}